

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O3

void __thiscall
semver::version<signed_char,_signed_char,_signed_char>::~version
          (version<signed_char,_signed_char,_signed_char> *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  std::
  vector<semver::detail::prerelease_identifier,_std::allocator<semver::detail::prerelease_identifier>_>
  ::~vector(&this->prerelease_identifiers);
  pcVar1 = (this->build_metadata_)._M_dataplus._M_p;
  paVar2 = &(this->build_metadata_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->prerelease_tag_)._M_dataplus._M_p;
  paVar2 = &(this->prerelease_tag_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

SEMVER_CONSTEXPR ~version() = default;